

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O1

connection_ptr __thiscall
websocketpp::endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
::get_con_from_hdl(endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                   *this,connection_hdl *hdl,error_code *ec)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  connection_ptr cVar5;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ec->_M_cat;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_00->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(undefined8 *)
     &(this->super_transport_type).super_socket_type.m_socket_init_handler.super__Function_base.
      _M_functor = 0;
    *(undefined8 *)
     ((long)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
             super__Function_base._M_functor + 8) = 0;
  }
  else {
    if (this_00->_M_use_count == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined8 *)ec;
    }
    *(undefined8 *)
     &(this->super_transport_type).super_socket_type.m_socket_init_handler.super__Function_base.
      _M_functor = uVar3;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
             super__Function_base._M_functor + 8) = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    ec = (error_code *)extraout_RDX;
  }
  if (*(long *)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
                super__Function_base._M_functor == 0) {
    if (error::get_category()::instance == '\0') {
      endpoint<websocketpp::connection<websocketpp::config::asio>,websocketpp::config::asio>::
      get_con_from_hdl();
      ec = (error_code *)extraout_RDX_00;
    }
    *in_RCX = 0xf;
    *(undefined8 **)(in_RCX + 2) = &error::get_category()::instance;
  }
  cVar5.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ec;
  cVar5.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (connection_ptr)
         cVar5.
         super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

connection_ptr get_con_from_hdl(connection_hdl hdl, lib::error_code & ec) {
        connection_ptr con = lib::static_pointer_cast<connection_type>(
            hdl.lock());
        if (!con) {
            ec = error::make_error_code(error::bad_connection);
        }
        return con;
    }